

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void rev_project_inertia(kcc_joint *joint,mc_abi *m,mc_abi *r)

{
  long lVar1;
  mc_abi *pmVar2;
  int i;
  long lVar3;
  long lVar4;
  double dVar5;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x15f,
                  "void rev_project_inertia(const struct kcc_joint *, const struct mc_abi *, struct mc_abi *)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x160,
                  "void rev_project_inertia(const struct kcc_joint *, const struct mc_abi *, struct mc_abi *)"
                 );
  }
  if (r == (mc_abi *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x161,
                  "void rev_project_inertia(const struct kcc_joint *, const struct mc_abi *, struct mc_abi *)"
                 );
  }
  if (m != r) {
    lVar1 = (long)(int)(joint->field_1).revolute_joint.axis;
    dVar5 = *(double *)((long)&(m->second_moment_of_mass).field_0 + lVar1 * 0x20) +
            *(joint->field_1).revolute_joint.inertia;
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      __assert_fail("d != 0.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x168,
                    "void rev_project_inertia(const struct kcc_joint *, const struct mc_abi *, struct mc_abi *)"
                   );
    }
    lVar3 = 0;
    pmVar2 = m;
    do {
      lVar4 = 9;
      do {
        *(double *)((long)r + lVar4 * 8 + -0x48) =
             *(double *)((long)pmVar2 + lVar4 * 8 + -0x48) -
             (*(double *)((long)&(m->first_moment_of_mass).field_0 + lVar3 * 8 + lVar1 * 0x18) *
             *(double *)((long)&(m->zeroth_moment_of_mass).field_0 + lVar4 * 8 + lVar1 * 0x18)) /
             dVar5;
        *(double *)((long)&(r->zeroth_moment_of_mass).field_0 + lVar4 * 8) =
             *(double *)((long)&(pmVar2->zeroth_moment_of_mass).field_0 + lVar4 * 8) -
             (*(double *)((long)&(m->second_moment_of_mass).field_0 + lVar1 * 8 + lVar3 * 0x18) *
             *(double *)((long)&(m->zeroth_moment_of_mass).field_0 + lVar4 * 8 + lVar1 * 0x18)) /
             dVar5;
        *(double *)((long)&(r->first_moment_of_mass).field_0 + lVar4 * 8) =
             *(double *)((long)&(pmVar2->first_moment_of_mass).field_0 + lVar4 * 8) -
             (*(double *)((long)&(m->second_moment_of_mass).field_0 + lVar1 * 8 + lVar3 * 0x18) *
             *(double *)((long)&(m->first_moment_of_mass).field_0 + lVar4 * 8 + lVar1 * 0x18)) /
             dVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xc);
      lVar3 = lVar3 + 1;
      r = (mc_abi *)((r->zeroth_moment_of_mass).field_0.row + 1);
      pmVar2 = (mc_abi *)((pmVar2->zeroth_moment_of_mass).field_0.row + 1);
    } while (lVar3 != 3);
    return;
  }
  __assert_fail("m != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x162,
                "void rev_project_inertia(const struct kcc_joint *, const struct mc_abi *, struct mc_abi *)"
               );
}

Assistant:

static void rev_project_inertia(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        struct mc_abi *r)
{
    assert(joint);
    assert(m);
    assert(r);
    assert(m != r);

    int k = joint->revolute_joint.axis;

    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];
    assert(d != 0.0);

    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 3; j++) {
            // The (__ik/d) element represents an entry in the projection matrix P
            // The __ij and __kj elements represent the entries of the inertia matrix M
            //     __ij is associated with the diagonal one-element of the projection matrix (the "identity" matrix part)
            //     -__kj is associated with the non-zero column of the projection matrix

            // 0th moment of mass matrix
            double m0ij = m->zeroth_moment_of_mass.row[i].data[j];
            double m0ik = m->first_moment_of_mass.row[k].data[i];    // consider transpose, thus [k, i]
            double m0kj = m->first_moment_of_mass.row[k].data[j];

            double pm0 = m0ij - (m0ik * m0kj) / d;

            r->zeroth_moment_of_mass.row[i].data[j] = pm0;


            // 1st moment of mass matrix
            double m1ij = m->first_moment_of_mass.row[i].data[j];
            double m1ik = m->second_moment_of_mass.row[i].data[k];
            double m1kj = m->first_moment_of_mass.row[k].data[j];
            double pm1 = m1ij - (m1ik * m1kj) / d;

            r->first_moment_of_mass.row[i].data[j] = pm1;


            // 2nd moment of mass matrix
            double mij = m->second_moment_of_mass.row[i].data[j];
            double mik = m->second_moment_of_mass.row[i].data[k];
            double mkj = m->second_moment_of_mass.row[k].data[j];
            double pm = mij - (mik * mkj) / d;

            r->second_moment_of_mass.row[i].data[j] = pm;
        }
    }
}